

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QGraphicsItemPrivate::ExtraStruct>::erase
          (QMovableArrayOps<QGraphicsItemPrivate::ExtraStruct> *this,ExtraStruct *b,qsizetype n)

{
  ExtraStruct *__src;
  ExtraStruct *pEVar1;
  long in_RDX;
  ExtraStruct *in_RSI;
  long in_RDI;
  ExtraStruct *e;
  ExtraStruct *in_stack_ffffffffffffffa8;
  ExtraStruct *in_stack_ffffffffffffffb0;
  
  __src = in_RSI + in_RDX;
  std::destroy<QGraphicsItemPrivate::ExtraStruct*>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  pEVar1 = QArrayDataPointer<QGraphicsItemPrivate::ExtraStruct>::begin
                     ((QArrayDataPointer<QGraphicsItemPrivate::ExtraStruct> *)0x99d067);
  if ((in_RSI == pEVar1) &&
     (pEVar1 = QArrayDataPointer<QGraphicsItemPrivate::ExtraStruct>::end
                         ((QArrayDataPointer<QGraphicsItemPrivate::ExtraStruct> *)
                          in_stack_ffffffffffffffb0), __src != pEVar1)) {
    *(ExtraStruct **)(in_RDI + 8) = __src;
  }
  else {
    pEVar1 = QArrayDataPointer<QGraphicsItemPrivate::ExtraStruct>::end
                       ((QArrayDataPointer<QGraphicsItemPrivate::ExtraStruct> *)
                        in_stack_ffffffffffffffb0);
    if (__src != pEVar1) {
      pEVar1 = QArrayDataPointer<QGraphicsItemPrivate::ExtraStruct>::end
                         ((QArrayDataPointer<QGraphicsItemPrivate::ExtraStruct> *)in_RSI);
      memmove(in_RSI,__src,(((long)pEVar1 - (long)__src) / 0x28) * 0x28);
    }
  }
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) - in_RDX;
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;

        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.

        std::destroy(b, e);
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else if (e != this->end()) {
            memmove(static_cast<void *>(b), static_cast<const void *>(e), (static_cast<const T *>(this->end()) - e)*sizeof(T));
        }
        this->size -= n;
    }